

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_bitstream(TrackData *trackdata)

{
  Encoding *pEVar1;
  Encoding EVar2;
  Encoding *pEVar3;
  bool bVar4;
  Track *this;
  size_t __n;
  Encoding *pEVar5;
  vector<Encoding,_std::allocator<Encoding>_> encodings;
  Encoding *local_88;
  Encoding *pEStack_80;
  long local_78;
  Encoding *local_68;
  void *local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  Encoding *local_40;
  undefined4 local_34;
  
  local_88 = (Encoding *)0x0;
  pEStack_80 = (Encoding *)0x0;
  local_78 = 0;
  if (opt.encoding == Unknown) {
    local_58 = (Encoding *)CONCAT44(1,scan_bitstream::last_encoding);
    uStack_50 = 4;
    uStack_4c = 5;
    uStack_48 = 10;
    local_44 = 9;
    std::vector<Encoding,std::allocator<Encoding>>::_M_assign_aux<Encoding_const*>
              ((vector<Encoding,std::allocator<Encoding>> *)&local_88,&local_58);
    local_58 = pEStack_80;
    local_40 = local_88;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,__gnu_cxx::__ops::_Iter_equals_val<Encoding_const>>
              (&local_68,&local_58,&local_40,&scan_bitstream::last_encoding);
    pEVar5 = local_68;
    pEVar1 = local_68 + -1;
    if (local_68 != pEStack_80) {
      __n = (long)pEStack_80 - (long)local_68;
      local_68 = pEVar1;
      memmove(pEVar1,pEVar5,__n);
      pEVar1 = local_68;
    }
    local_68 = pEVar1;
    pEStack_80 = pEStack_80 + -1;
    pEVar1 = local_88;
    pEVar5 = pEStack_80;
    if (scan_bitstream::last_encoding == FM) {
      local_34 = 1;
      local_40 = local_88;
      local_58 = pEStack_80;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,__gnu_cxx::__ops::_Iter_equals_val<Encoding_const>>
                (&local_60);
      pEVar1 = (Encoding *)((long)local_60 + 4);
      if (pEVar1 != pEStack_80) {
        memmove(local_60,pEVar1,(long)pEStack_80 - (long)pEVar1);
      }
      pEVar5 = pEStack_80 + -1;
      pEVar1 = local_88;
      pEStack_80 = pEVar5;
    }
  }
  else {
    local_58 = (Encoding *)CONCAT44(local_58._4_4_,opt.encoding);
    std::vector<Encoding,std::allocator<Encoding>>::_M_assign_aux<Encoding_const*>
              ((vector<Encoding,std::allocator<Encoding>> *)&local_88,&local_58);
    pEVar1 = local_88;
    pEVar5 = pEStack_80;
  }
  for (; pEVar3 = pEStack_80, bVar4 = pEVar1 != pEStack_80, EVar2 = scan_bitstream::last_encoding,
      pEStack_80 = pEVar5, bVar4; pEVar1 = pEVar1 + 1) {
    EVar2 = *pEVar1;
    switch(EVar2) {
    case MFM:
    case FM:
    case RX02:
      scan_bitstream_mfm_fm(trackdata);
      break;
    case Amiga:
      scan_bitstream_amiga(trackdata);
      break;
    case GCR:
      scan_bitstream_gcr(trackdata);
      break;
    case Ace:
      scan_bitstream_ace(trackdata);
      break;
    case MX:
      scan_bitstream_mx(trackdata);
      break;
    case Agat:
      scan_bitstream_agat(trackdata);
      break;
    case Apple:
      scan_bitstream_apple(trackdata);
      break;
    case Victor:
      scan_bitstream_victor(trackdata);
      break;
    case Vista:
      scan_bitstream_vista(trackdata);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/BitstreamDecoder.cpp"
                    ,0xbb,"void scan_bitstream(TrackData &)");
    }
    this = TrackData::track(trackdata);
    bVar4 = Track::empty(this);
    if (!bVar4 && opt.multiformat == 0) break;
    pEVar5 = pEStack_80;
    pEStack_80 = pEVar3;
  }
  scan_bitstream::last_encoding = EVar2;
  if (local_88 != (Encoding *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return;
}

Assistant:

void scan_bitstream(TrackData& trackdata)
{
    static Encoding last_encoding = Encoding::MFM;

    std::vector<Encoding> encodings;
    if (opt.encoding != Encoding::Unknown)
    {
        // Just the one requested format.
        encodings = { opt.encoding };
    }
    else
    {
        // Scan for formats, starting with the last successful encoding.
        encodings = { last_encoding, Encoding::MFM, Encoding::Amiga, Encoding::GCR, Encoding::Victor, Encoding::Apple };
        encodings.erase(std::next(std::find(encodings.rbegin(), encodings.rend(), last_encoding)).base());

        // MFM and FM use the same scanner, so remove the duplicate
        if (last_encoding == Encoding::FM)
            encodings.erase(std::find(encodings.rbegin(), encodings.rend(), Encoding::MFM).base());
    }

    for (auto encoding : encodings)
    {
        switch (encoding)
        {
        case Encoding::MFM:
        case Encoding::FM:
        case Encoding::RX02:
            scan_bitstream_mfm_fm(trackdata);
            break;

        case Encoding::Amiga:
            scan_bitstream_amiga(trackdata);
            break;

            // Apple Disk ][ GCR
        case Encoding::Apple:
            scan_bitstream_apple(trackdata);
            break;

            // Commodore 64 GCR
        case Encoding::GCR:
            scan_bitstream_gcr(trackdata);
            break;

        case Encoding::Ace:
            scan_bitstream_ace(trackdata);
            break;

        case Encoding::MX:
            scan_bitstream_mx(trackdata);
            break;

        case Encoding::Agat:
            scan_bitstream_agat(trackdata);
            break;

        case Encoding::Victor:
            scan_bitstream_victor(trackdata);
            break;

        case Encoding::Vista:
            scan_bitstream_vista(trackdata);
            break;

        default:
            assert(false);
            break;
        }

        // Stop if we found something and we're not scanning multiple formats.
        if (!trackdata.track().empty() && !opt.multiformat)
        {
            // Remember the encoding so we try it first next time
            last_encoding = encoding;
            break;
        }
    }
}